

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ch_string * register_allocated_string(ch_context *vm,char *value,size_t size)

{
  ch_context *key;
  ch_table *table;
  ch_primitive value_00;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_40;
  ch_context *local_38;
  ch_string *string;
  ch_string *interned_string;
  size_t size_local;
  char *value_local;
  ch_context *vm_local;
  
  interned_string = (ch_string *)size;
  size_local = (size_t)value;
  value_local = (char *)vm;
  string = ch_table_find_string(&vm->strings,value,size);
  if (string == (ch_string *)0x0) {
    key = (ch_context *)new_string((char *)size_local,(size_t)interned_string);
    table = (ch_table *)(value_local + 0x1860);
    local_38 = key;
    memset(&local_40,0,8);
    value_00.field_1.number_value = local_40.number_value;
    value_00._0_8_ = 2;
    ch_table_set(table,(ch_string *)key,value_00);
    vm_local = local_38;
  }
  else {
    free((void *)size_local);
    vm_local = (ch_context *)string;
  }
  return (ch_string *)vm_local;
}

Assistant:

static ch_string *register_allocated_string(ch_context* vm, char* value, size_t size) {
  ch_string *interned_string = ch_table_find_string(&vm->strings, value, size);
  if (interned_string != NULL) {
    free(value);
    return interned_string;
  }

  ch_string *string = new_string(value, size);
  ch_table_set(&vm->strings, string, MAKE_NULL());

  return string;
}